

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
          (SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *this,int *key,VmConstant **value)

{
  Node *pNVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *__assertion;
  int iVar6;
  
  iVar3 = *key;
  if (iVar3 == 0) {
    __assertion = "key != Key()";
    uVar4 = 0x3b;
  }
  else {
    uVar4 = this->bucketCount;
    if (uVar4 <= (this->count >> 2) + this->count) {
      rehash(this);
      uVar4 = this->bucketCount;
      iVar3 = *key;
    }
    uVar5 = iVar3 * -0x61c8864f;
    for (iVar6 = 1; iVar6 - uVar4 != 1; iVar6 = iVar6 + 1) {
      uVar5 = uVar5 & uVar4 - 1;
      pNVar1 = this->data + uVar5;
      iVar2 = this->data[uVar5].key;
      if (iVar2 == 0) {
        pNVar1->key = iVar3;
        pNVar1->value = *value;
        this->count = this->count + 1;
        return;
      }
      if (iVar2 == iVar3) {
        pNVar1->value = *value;
        return;
      }
      uVar5 = uVar5 + iVar6;
    }
    __assertion = "!\"couldn\'t insert node\"";
    uVar4 = 0x5b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,uVar4,
                "void SmallDenseMap<int, VmConstant *, IntHasher, 8>::insert(const Key &, const Value &) [Key = int, Value = VmConstant *, Hasher = IntHasher, N = 8]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}